

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,ContinueStmt *node)

{
  CompileError *this_00;
  mapped_type *pmVar1;
  ContinueStmt *local_20;
  
  if (this->inLoop != false) {
    return;
  }
  this_00 = (CompileError *)__cxa_allocate_exception(0x48);
  local_20 = node;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this->pos,(key_type *)&local_20);
  CompileError::CompileError(this_00,pmVar1->first,pmVar1->second);
  *(undefined ***)this_00 = &PTR__CompileError_001f3b20;
  __cxa_throw(this_00,&ContinueOutOfALoop::typeinfo,CompileError::~CompileError);
}

Assistant:

void operator()(ast::ContinueStmt &node) const override {
    if (!inLoop)
      throw ContinueOutOfALoop(pos.at(node.getID()));
  }